

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  uint uVar1;
  int iVar2;
  lua_State *L;
  time_t tVar3;
  anon_union_32_2_9473004a_for_u *paVar4;
  size_t t;
  lua_State *plVar5;
  uint h;
  char buff [32];
  uint local_4c;
  lua_State *local_48;
  uint *local_40;
  TValue *local_38;
  code *local_30;
  
  L = (lua_State *)(*f)(ud,(void *)0x0,8,0x2c0);
  plVar5 = (lua_State *)0x0;
  if (L != (lua_State *)0x0) {
    L->next = (GCObject *)0x0;
    L->tt = '\b';
    L[1].field_0x54 = 0x21;
    L->marked = '\x01';
    L->status = '\0';
    L[1].field_0x56 = 0;
    L->l_G = (global_State *)(L + 1);
    L->stack = (StkId)0x0;
    L->ci = (CallInfo *)0x0;
    L->stacksize = 0;
    L->nny = 1;
    L->nCcalls = 0;
    L->errorJmp = (lua_longjmp *)0x0;
    L->errfunc = 0;
    L->hook = (lua_Hook)0x0;
    L->openupval = (GCObject *)0x0;
    L->hookmask = '\0';
    L->allowhook = '\x01';
    L->basehookcount = 0;
    L->hookcount = 0;
    L[1].next = (GCObject *)f;
    *(void **)&L[1].tt = ud;
    L[2].stack = (StkId)L;
    tVar3 = time((time_t *)0x0);
    local_40 = &local_4c;
    local_4c = (uint)tVar3;
    local_38 = &luaO_nilobject_;
    local_30 = lua_newstate;
    local_48 = L;
    uVar1 = luaS_hash((char *)&local_48,0x20,local_4c);
    L[1].hookcount = uVar1;
    paVar4 = &L[1].base_ci.u;
    *(anon_union_32_2_9473004a_for_u **)((long)&L[1].base_ci.u + 0x18) = paVar4;
    L[2].next = (GCObject *)paVar4;
    L[1].field_0x57 = 0;
    L[1].hookmask = '\0';
    L[1].allowhook = '\0';
    *(undefined2 *)&L[1].field_0x4a = 0;
    L[2].tt = '\0';
    L[2].marked = '\0';
    L[2].status = '\0';
    *(undefined5 *)&L[2].field_0xb = 0;
    L[2].l_G = (global_State *)0x0;
    L[2].stack_last = (StkId)0x0;
    L[2].stacksize = 0;
    L[2].nny = 0;
    L[2].nCcalls = 0;
    L[1].oldpc = (Instruction *)0x0;
    L[1].stack_last = (StkId)0x0;
    L[1].stack = (StkId)0x0;
    L[1].field_0x55 = 5;
    L[1].openupval = (GCObject *)0x0;
    L[1].gclist = (GCObject *)0x0;
    L[1].errorJmp = (lua_longjmp *)0x0;
    L[1].errfunc = 0;
    L[1].base_ci.func = (StkId)0x0;
    L[1].base_ci.top = (StkId)0x0;
    L[1].base_ci.previous = (CallInfo *)0x0;
    L[1].base_ci.next = (CallInfo *)0x0;
    L[1].base_ci.nresults = 0;
    L[1].base_ci.callstatus = '\0';
    *(undefined5 *)&L[1].base_ci.field_0x23 = 0;
    L[1].base_ci.extra = 0;
    L[1].top = (StkId)0x2c0;
    L[1].l_G = (global_State *)0x0;
    L[2].ci = (CallInfo *)0xc8000000c8;
    *(undefined4 *)&L[2].oldpc = 200;
    L[3].hookmask = '\0';
    L[3].allowhook = '\0';
    *(undefined2 *)&L[3].field_0x4a = 0;
    L[3].basehookcount = 0;
    L[3].stack = (StkId)0x0;
    L[3].stacksize = 0;
    L[3].nny = 0;
    L[3].nCcalls = 0;
    L[3].oldpc = (Instruction *)0x0;
    L[3].stack_last = (StkId)0x0;
    L[3].l_G = (global_State *)0x0;
    L[3].ci = (CallInfo *)0x0;
    L[3].tt = '\0';
    L[3].marked = '\0';
    L[3].status = '\0';
    *(undefined5 *)&L[3].field_0xb = 0;
    L[3].top = (StkId)0x0;
    iVar2 = luaD_rawrunprotected(L,f_luaopen,(void *)0x0);
    plVar5 = L;
    if (iVar2 != 0) {
      close_state(L);
      plVar5 = (lua_State *)0x0;
    }
  }
  return plVar5;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;
  LG *l = cast(LG *, (*f)(ud, NULL, LUA_TTHREAD, sizeof(LG)));
  if (l == NULL) return NULL;
  L = &l->l.l;
  g = &l->g;
  L->next = NULL;
  L->tt = LUA_TTHREAD;
  g->currentwhite = bit2mask(WHITE0BIT, FIXEDBIT);
  L->marked = luaC_white(g);
  g->gckind = KGC_NORMAL;
  preinit_state(L, g);
  g->frealloc = f;
  g->ud = ud;
  g->mainthread = L;
  g->seed = makeseed(L);
  g->uvhead.u.l.prev = &g->uvhead;
  g->uvhead.u.l.next = &g->uvhead;
  g->gcrunning = 0;  /* no GC while building state */
  g->GCestimate = 0;
  g->strt.size = 0;
  g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  luaZ_initbuffer(L, &g->buff);
  g->panic = NULL;
  g->version = NULL;
  g->gcstate = GCSpause;
  g->allgc = NULL;
  g->finobj = NULL;
  g->tobefnz = NULL;
  g->sweepgc = g->sweepfin = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->totalbytes = sizeof(LG);
  g->GCdebt = 0;
  g->gcpause = LUAI_GCPAUSE;
  g->gcmajorinc = LUAI_GCMAJOR;
  g->gcstepmul = LUAI_GCMUL;
  for (i=0; i < LUA_NUMTAGS; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  return L;
}